

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_lpCall(HighsInt num_col,HighsInt num_row,HighsInt num_nz,HighsInt a_format,
                     HighsInt sense,double offset,double *col_cost,double *col_lower,
                     double *col_upper,double *row_lower,double *row_upper,HighsInt *a_start,
                     HighsInt *a_index,double *a_value,double *col_value,double *col_dual,
                     double *row_value,double *row_dual,HighsInt *col_basis_status,
                     HighsInt *row_basis_status,HighsInt *model_status)

{
  HighsStatus HVar1;
  ulong uVar2;
  string local_5210;
  Highs highs;
  
  Highs::Highs(&highs);
  local_5210._M_dataplus._M_p = (pointer)&local_5210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5210,"output_flag","");
  Highs::setOptionValue(&highs,&local_5210,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5210._M_dataplus._M_p != &local_5210.field_2) {
    operator_delete(local_5210._M_dataplus._M_p);
  }
  *model_status = 0;
  HVar1 = Highs::passModel(&highs,num_col,num_row,num_nz,a_format,sense,offset,col_cost,col_lower,
                           col_upper,row_lower,row_upper,a_start,a_index,a_value,(HighsInt *)0x0);
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = Highs::run(&highs);
    if (HVar1 == kOk) {
      *model_status = highs.model_status_;
      if (0 < num_col) {
        uVar2 = 0;
        do {
          if (col_value != (double *)0x0 &&
              highs.info_.super_HighsInfoStruct.primal_solution_status != 0) {
            col_value[uVar2] =
                 highs.solution_.col_value.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          if (col_dual != (double *)0x0 &&
              highs.info_.super_HighsInfoStruct.dual_solution_status != 0) {
            col_dual[uVar2] =
                 highs.solution_.col_dual.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          if ((col_basis_status != (HighsInt *)0x0 & highs.basis_.valid) != 0) {
            col_basis_status[uVar2] =
                 (uint)highs.basis_.col_status.
                       super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          uVar2 = uVar2 + 1;
        } while ((uint)num_col != uVar2);
      }
      if (0 < num_row) {
        uVar2 = 0;
        do {
          if (row_value != (double *)0x0 &&
              highs.info_.super_HighsInfoStruct.primal_solution_status != 0) {
            row_value[uVar2] =
                 highs.solution_.row_value.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          if (row_dual != (double *)0x0 &&
              highs.info_.super_HighsInfoStruct.dual_solution_status != 0) {
            row_dual[uVar2] =
                 highs.solution_.row_dual.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          if ((row_basis_status != (HighsInt *)0x0 & highs.basis_.valid) != 0) {
            row_basis_status[uVar2] =
                 (uint)highs.basis_.row_status.
                       super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar2];
          }
          uVar2 = uVar2 + 1;
        } while ((uint)num_row != uVar2);
      }
      HVar1 = kOk;
    }
  }
  Highs::~Highs(&highs);
  return HVar1;
}

Assistant:

HighsInt Highs_lpCall(const HighsInt num_col, const HighsInt num_row,
                      const HighsInt num_nz, const HighsInt a_format,
                      const HighsInt sense, const double offset,
                      const double* col_cost, const double* col_lower,
                      const double* col_upper, const double* row_lower,
                      const double* row_upper, const HighsInt* a_start,
                      const HighsInt* a_index, const double* a_value,
                      double* col_value, double* col_dual, double* row_value,
                      double* row_dual, HighsInt* col_basis_status,
                      HighsInt* row_basis_status, HighsInt* model_status) {
  Highs highs;
  highs.setOptionValue("output_flag", false);
  *model_status = kHighsModelStatusNotset;
  HighsStatus status = highs.passModel(
      num_col, num_row, num_nz, a_format, sense, offset, col_cost, col_lower,
      col_upper, row_lower, row_upper, a_start, a_index, a_value);
  if (status == HighsStatus::kError) return (HighsInt)status;

  status = highs.run();

  if (status == HighsStatus::kOk) {
    const HighsSolution& solution = highs.getSolution();
    const HighsBasis& basis = highs.getBasis();
    *model_status = (HighsInt)highs.getModelStatus();
    const HighsInfo& info = highs.getInfo();

    const bool copy_col_value =
        col_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_dual =
        col_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_basis = col_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_col; i++) {
      if (copy_col_value) col_value[i] = solution.col_value[i];
      if (copy_col_dual) col_dual[i] = solution.col_dual[i];
      if (copy_col_basis) col_basis_status[i] = (HighsInt)basis.col_status[i];
    }

    const bool copy_row_value =
        row_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_dual =
        row_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_basis = row_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_row; i++) {
      if (copy_row_value) row_value[i] = solution.row_value[i];
      if (copy_row_dual) row_dual[i] = solution.row_dual[i];
      if (copy_row_basis) row_basis_status[i] = (HighsInt)basis.row_status[i];
    }
  }
  return (HighsInt)status;
}